

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O1

MPP_RET check_super_frame(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  EncFrmType EVar1;
  MppEncRcSuperFrameMode MVar2;
  MPP_RET MVar3;
  
  EVar1 = cfg->frame_type;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","check_super_frame",ctx);
  }
  MVar2 = (ctx->usr_cfg).super_cfg.super_mode;
  MVar3 = MPP_OK;
  if (((MVar2 != MPP_ENC_RC_SUPER_FRM_NONE) &&
      (MVar3 = MPP_OK,
      (uint)(ctx->usr_cfg).hier_qp_cfg.hier_qp_delta[(ulong)(EVar1 != INTRA_FRAME) - 6] <=
      (uint)cfg->bit_real)) && (MVar3 = MPP_NOK, MVar2 == MPP_ENC_RC_SUPER_FRM_DROP)) {
    if (((byte)rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","super frame drop current frame","check_super_frame");
    }
    (ctx->usr_cfg).drop_mode = MPP_ENC_RC_DROP_FRM_NORMAL;
    (ctx->usr_cfg).drop_gap = 0;
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","check_super_frame",ctx);
  }
  return MVar3;
}

Assistant:

MPP_RET check_super_frame(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_S32 frame_type = cfg->frame_type;
    RK_U32 bits_thr = 0;
    RcCfg *usr_cfg = &ctx->usr_cfg;

    rc_dbg_func("enter %p\n", ctx);
    if (usr_cfg->super_cfg.super_mode) {
        bits_thr = usr_cfg->super_cfg.super_p_thd;
        if (frame_type == INTRA_FRAME) {
            bits_thr = usr_cfg->super_cfg.super_i_thd;
        }

        if ((RK_U32)cfg->bit_real >= bits_thr) {
            if (usr_cfg->super_cfg.super_mode == MPP_ENC_RC_SUPER_FRM_DROP) {
                rc_dbg_rc("super frame drop current frame");
                usr_cfg->drop_mode = MPP_ENC_RC_DROP_FRM_NORMAL;
                usr_cfg->drop_gap  = 0;
            }
            ret = MPP_NOK;
        }
    }
    rc_dbg_func("leave %p\n", ctx);
    return ret;
}